

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

STAmount * jbcoin::divide(STAmount *__return_storage_ptr__,STAmount *num,STAmount *den,Issue *issue)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  int local_48;
  int local_44;
  int denOffset;
  int numOffset;
  uint64_t denVal;
  uint64_t numVal;
  Issue *issue_local;
  STAmount *den_local;
  STAmount *num_local;
  
  bVar1 = beast::operator==(den);
  if (bVar1) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
  }
  bVar1 = beast::operator==(num);
  if (bVar1) {
    STAmount::STAmount(__return_storage_ptr__,issue,0,0,false);
  }
  else {
    denVal = STAmount::mantissa(num);
    _denOffset = STAmount::mantissa(den);
    local_44 = STAmount::exponent(num);
    local_48 = STAmount::exponent(den);
    bVar1 = STAmount::native(num);
    if (bVar1) {
      for (; denVal < 1000000000000000; denVal = denVal * 10) {
        local_44 = local_44 + -1;
      }
    }
    bVar1 = STAmount::native(den);
    if (bVar1) {
      for (; _denOffset < 1000000000000000; _denOffset = _denOffset * 10) {
        local_48 = local_48 + -1;
      }
    }
    uVar3 = muldiv(denVal,100000000000000000,_denOffset);
    bVar1 = STAmount::negative(num);
    bVar2 = STAmount::negative(den);
    STAmount::STAmount(__return_storage_ptr__,issue,uVar3 + 5,(local_44 - local_48) + -0x11,
                       bVar1 != bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

STAmount
divide (STAmount const& num, STAmount const& den, Issue const& issue)
{
    if (den == zero)
        Throw<std::runtime_error> ("division by zero");

    if (num == zero)
        return {issue};

    std::uint64_t numVal = num.mantissa();
    std::uint64_t denVal = den.mantissa();
    int numOffset = num.exponent();
    int denOffset = den.exponent();

    if (num.native())
    {
        while (numVal < STAmount::cMinValue)
        {
            // Need to bring into range
            numVal *= 10;
            --numOffset;
        }
    }

    if (den.native())
    {
        while (denVal < STAmount::cMinValue)
        {
            denVal *= 10;
            --denOffset;
        }
    }

    // We divide the two mantissas (each is between 10^15
    // and 10^16). To maintain precision, we multiply the
    // numerator by 10^17 (the product is in the range of
    // 10^32 to 10^33) followed by a division, so the result
    // is in the range of 10^16 to 10^15.
    return STAmount (issue,
        muldiv(numVal, tenTo17, denVal) + 5,
        numOffset - denOffset - 17,
        num.negative() != den.negative());
}